

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O0

ProductionPtr __thiscall
avro::parsing::ValidatingGrammarGenerator::doGenerate
          (ValidatingGrammarGenerator *this,NodePtr *n,
          map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
          *m)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  type pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator n_00;
  pointer ppVar5;
  Exception *this_00;
  undefined8 in_RCX;
  shared_ptr<avro::Node> *in_RDX;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  sp_counted_base *extraout_RDX_01;
  sp_counted_base *extraout_RDX_02;
  sp_counted_base *extraout_RDX_03;
  sp_counted_base *extraout_RDX_04;
  sp_counted_base *extraout_RDX_05;
  sp_counted_base *extraout_RDX_06;
  sp_counted_base *extraout_RDX_07;
  sp_counted_base *extraout_RDX_08;
  sp_counted_base *extraout_RDX_09;
  sp_counted_base *extraout_RDX_10;
  sp_counted_base *extraout_RDX_11;
  sp_counted_base *extraout_RDX_12;
  sp_counted_base *extraout_RDX_13;
  shared_count sVar6;
  undefined8 *in_RSI;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *in_RDI;
  ProductionPtr PVar7;
  iterator it;
  NodePtr nn;
  shared_ptr<avro::NodeSymbolic> ns;
  size_t i_1;
  size_t c_1;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  vv;
  ProductionPtr v_1;
  ProductionPtr pp;
  ProductionPtr v;
  NodePtr *leaf;
  size_t i;
  size_t c;
  ProductionPtr *result;
  string *in_stack_fffffffffffffb58;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *in_stack_fffffffffffffb60;
  __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  in_stack_fffffffffffffb68;
  __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  in_stack_fffffffffffffb70;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  bool bVar8;
  reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  *in_stack_fffffffffffffb88;
  allocator<char> *in_stack_fffffffffffffb90;
  shared_ptr<avro::NodeSymbolic> *this_01;
  back_insert_iterator<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *in_stack_fffffffffffffba8;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *in_stack_fffffffffffffbb0;
  undefined1 uVar9;
  ProductionPtr *in_stack_fffffffffffffbb8;
  Symbol *in_stack_fffffffffffffbd0;
  int *in_stack_fffffffffffffbd8;
  NodeSymbolic *in_stack_fffffffffffffc78;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_2f0;
  undefined4 local_2dc;
  _Self local_2d8;
  _Self local_2d0 [3];
  shared_ptr<avro::NodeSymbolic> local_2b8 [3];
  undefined1 local_281;
  undefined1 local_280 [16];
  ulong local_270;
  ulong local_268;
  undefined1 local_211;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_200;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_1f0 [2];
  undefined1 local_1d0 [55];
  undefined1 local_199;
  undefined1 local_171;
  Symbol *local_170;
  Symbol *local_168;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *local_160;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *local_158;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_140;
  undefined8 local_130;
  ulong local_128;
  ulong local_120;
  undefined1 local_111;
  undefined1 local_e9;
  undefined4 local_d4;
  undefined4 local_bc;
  undefined4 local_a4;
  undefined4 local_8c;
  undefined4 local_74;
  undefined4 local_5c;
  undefined4 local_48;
  undefined4 local_24;
  undefined8 local_20;
  shared_ptr<avro::Node> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  pNVar4 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  TVar2 = Node::type(pNVar4);
  switch(TVar2) {
  case AVRO_STRING:
    local_bc = 1;
    Symbol::stringSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b780);
    sVar6.pi_ = extraout_RDX_05;
    break;
  case AVRO_BYTES:
    local_d4 = 1;
    Symbol::bytesSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b7f7);
    sVar6.pi_ = extraout_RDX_06;
    break;
  case AVRO_INT:
    local_5c = 1;
    Symbol::intSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b5a4);
    sVar6.pi_ = extraout_RDX_01;
    break;
  case AVRO_LONG:
    local_74 = 1;
    Symbol::longSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b61b);
    sVar6.pi_ = extraout_RDX_02;
    break;
  case AVRO_FLOAT:
    local_8c = 1;
    Symbol::floatSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b692);
    sVar6.pi_ = extraout_RDX_03;
    break;
  case AVRO_DOUBLE:
    local_a4 = 1;
    Symbol::doubleSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b709);
    sVar6.pi_ = extraout_RDX_04;
    break;
  case AVRO_BOOL:
    local_48 = 1;
    Symbol::boolSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b52d);
    sVar6.pi_ = extraout_RDX_00;
    break;
  case AVRO_NULL:
    local_24 = 1;
    Symbol::nullSymbol();
    boost::
    make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    Symbol::~Symbol((Symbol *)0x28b4b6);
    sVar6.pi_ = extraout_RDX;
    break;
  case AVRO_RECORD:
    local_111 = 0;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    std::
    map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
    ::erase((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             *)in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    iVar3 = (*pNVar4->_vptr_Node[4])();
    local_120 = CONCAT44(extraout_var,iVar3);
    for (local_128 = 0; local_128 < local_120; local_128 = local_128 + 1) {
      pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
      iVar3 = (*pNVar4->_vptr_Node[5])(pNVar4,local_128 & 0xffffffff);
      local_130 = CONCAT44(extraout_var_00,iVar3);
      (**(code **)*in_RSI)(&local_140,in_RSI,local_130,local_20);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator->(&local_140);
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::rbegin
                ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 in_stack_fffffffffffffb68._M_current);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator->(&local_140);
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::rend
                ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 in_stack_fffffffffffffb68._M_current);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator*(in_RDI);
      local_158 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                  std::
                  back_inserter<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                              *)in_stack_fffffffffffffb58);
      local_160 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                  std::
                  copy<std::reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>,std::back_insert_iterator<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                            ((reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
                              *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                             in_stack_fffffffffffffb98);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x28bb55);
    }
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    local_168 = (Symbol *)
                std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::begin
                          ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                           in_stack_fffffffffffffb58);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    local_170 = (Symbol *)
                std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::end
                          ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                           in_stack_fffffffffffffb58);
    std::
    reverse<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::
    map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
    ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                  *)in_stack_fffffffffffffba0,(key_type *)in_stack_fffffffffffffb98.container);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator=((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)in_stack_fffffffffffffb70._M_current,
              (shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)in_stack_fffffffffffffb68._M_current);
    sVar6.pi_ = extraout_RDX_08;
    break;
  case AVRO_ENUM:
    local_171 = 0;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar4->_vptr_Node[7])();
    Symbol::sizeCheckSymbol((size_t)in_stack_fffffffffffffb58);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28bcf0);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::enumSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28bd38);
    std::
    map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
    ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                  *)in_stack_fffffffffffffba0,(key_type *)in_stack_fffffffffffffb98.container);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator=((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)in_stack_fffffffffffffb70._M_current,
              (shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)in_stack_fffffffffffffb68._M_current);
    sVar6.pi_ = extraout_RDX_09;
    break;
  case AVRO_ARRAY:
    local_199 = 0;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffbb0 >> 0x38);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::arrayEndSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28be5d);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    iVar3 = (*pNVar4->_vptr_Node[5])(pNVar4,0);
    (**(code **)*in_RSI)(local_1d0,in_RSI,iVar3,local_20);
    Symbol::repeater(in_stack_fffffffffffffbb8,(bool)uVar9);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28bf01);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    ~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x28bf0e);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::arrayStartSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28bf56);
    sVar6.pi_ = extraout_RDX_10;
    break;
  case AVRO_MAP:
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    iVar3 = (*pNVar4->_vptr_Node[5])(pNVar4,1);
    (**(code **)*in_RSI)(local_1f0,in_RSI,iVar3,local_20);
    operator_new(0x18);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator*(local_1f0);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::vector
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffbb0 >> 0x38);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
    shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
              ((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               in_stack_fffffffffffffb78);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(&local_200);
    Symbol::stringSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28c107);
    local_211 = 0;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::mapEndSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28c160);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::repeater(in_stack_fffffffffffffbb8,(bool)uVar9);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28c1ac);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::mapStartSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28c1ee);
    local_211 = 1;
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    ~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x28c328);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    ~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x28c335);
    sVar6.pi_ = extraout_RDX_11;
    break;
  case AVRO_UNION:
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::vector((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
              *)0x28c373);
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    iVar3 = (*pNVar4->_vptr_Node[4])();
    local_268 = CONCAT44(extraout_var_01,iVar3);
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::reserve((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               *)in_stack_fffffffffffffb90,(size_type)in_stack_fffffffffffffb88);
    for (local_270 = 0; local_270 < local_268; local_270 = local_270 + 1) {
      pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
      iVar3 = (*pNVar4->_vptr_Node[5])(pNVar4,local_270 & 0xffffffff);
      (**(code **)*in_RSI)(local_280,in_RSI,iVar3,local_20);
      std::
      vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
      ::push_back((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                   *)in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x28c44b);
    }
    local_281 = 0;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::alternative((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                         *)in_stack_fffffffffffffb98.container);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28c504);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::unionSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28c546);
    local_281 = 1;
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::~vector((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               *)in_stack_fffffffffffffb70._M_current);
    sVar6.pi_ = extraout_RDX_12;
    break;
  case AVRO_FIXED:
    local_e9 = 0;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar4->_vptr_Node[10])();
    Symbol::sizeCheckSymbol((size_t)in_stack_fffffffffffffb58);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28b8ab);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(in_RDI);
    Symbol::fixedSymbol();
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    Symbol::~Symbol((Symbol *)0x28b8f3);
    std::
    map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
    ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                  *)in_stack_fffffffffffffba0,(key_type *)in_stack_fffffffffffffb98.container);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator=((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)in_stack_fffffffffffffb70._M_current,
              (shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)in_stack_fffffffffffffb68._M_current);
    sVar6.pi_ = extraout_RDX_07;
    break;
  case AVRO_NUM_TYPES:
    this_01 = local_2b8;
    boost::static_pointer_cast<avro::NodeSymbolic,avro::Node>
              ((shared_ptr<avro::Node> *)in_stack_fffffffffffffb68._M_current);
    boost::shared_ptr<avro::NodeSymbolic>::operator->(this_01);
    NodeSymbolic::getNode(in_stack_fffffffffffffc78);
    n_00 = std::
           map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
           ::find((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                   *)in_stack_fffffffffffffb58,(key_type *)0x28c63f);
    local_2d0[0]._M_node = n_00._M_node;
    local_2d8._M_node =
         (_Base_ptr)
         std::
         map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
         ::end((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                *)in_stack_fffffffffffffb58);
    bVar1 = std::operator!=(local_2d0,&local_2d8);
    bVar8 = false;
    if (bVar1) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                             *)0x28c699);
      bVar8 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)&ppVar5->second);
    }
    if (bVar8 == false) {
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)0x28c723);
      std::
      map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
      ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                    *)in_stack_fffffffffffffba0,(key_type *)in_stack_fffffffffffffb98.container);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator=(&local_2f0,
                  (shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)in_stack_fffffffffffffb68._M_current);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x28c760);
      Symbol::placeholder<boost::shared_ptr<avro::Node>>((shared_ptr<avro::Node> *)n_00._M_node);
      boost::
      make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      Symbol::~Symbol((Symbol *)0x28c7ae);
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                    *)0x28c6c0);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::shared_ptr(in_stack_fffffffffffffb60,
                   (shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)in_stack_fffffffffffffb58);
    }
    local_2dc = 1;
    boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x28c80e);
    boost::shared_ptr<avro::NodeSymbolic>::~shared_ptr((shared_ptr<avro::NodeSymbolic> *)0x28c81b);
    sVar6.pi_ = extraout_RDX_13;
    break;
  default:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98.container,
               in_stack_fffffffffffffb90);
    Exception::Exception(this_00,in_stack_fffffffffffffb58);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  PVar7.pn.pi_ = sVar6.pi_;
  PVar7.px = (element_type *)in_RDI;
  return PVar7;
}

Assistant:

ProductionPtr ValidatingGrammarGenerator::doGenerate(const NodePtr& n,
    map<NodePtr, ProductionPtr> &m) {
    switch (n->type()) {
    case AVRO_NULL:
        return make_shared<Production>(1, Symbol::nullSymbol());
    case AVRO_BOOL:
        return make_shared<Production>(1, Symbol::boolSymbol());
    case AVRO_INT:
        return make_shared<Production>(1, Symbol::intSymbol());
    case AVRO_LONG:
        return make_shared<Production>(1, Symbol::longSymbol());
    case AVRO_FLOAT:
        return make_shared<Production>(1, Symbol::floatSymbol());
    case AVRO_DOUBLE:
        return make_shared<Production>(1, Symbol::doubleSymbol());
    case AVRO_STRING:
        return make_shared<Production>(1, Symbol::stringSymbol());
    case AVRO_BYTES:
        return make_shared<Production>(1, Symbol::bytesSymbol());
    case AVRO_FIXED:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::sizeCheckSymbol(n->fixedSize()));
            result->push_back(Symbol::fixedSymbol());
            m[n] = result;
            return result;
        }
    case AVRO_RECORD:
        {
            ProductionPtr result = make_shared<Production>();

            m.erase(n);
            size_t c = n->leaves();
            for (size_t i = 0; i < c; ++i) {
                const NodePtr& leaf = n->leafAt(i);
                ProductionPtr v = doGenerate(leaf, m);
                copy(v->rbegin(), v->rend(), back_inserter(*result));
            }
            reverse(result->begin(), result->end());

            m[n] = result;
            return result;
        }
    case AVRO_ENUM:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::sizeCheckSymbol(n->names()));
            result->push_back(Symbol::enumSymbol());
            m[n] = result;
            return result;
        }
    case AVRO_ARRAY:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::arrayEndSymbol());
            result->push_back(Symbol::repeater(doGenerate(n->leafAt(0), m), true));
            result->push_back(Symbol::arrayStartSymbol());
            return result;
        }
    case AVRO_MAP:
        {
            ProductionPtr pp = doGenerate(n->leafAt(1), m);
			ProductionPtr v(new Production(*pp));
            v->push_back(Symbol::stringSymbol());
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::mapEndSymbol());
            result->push_back(Symbol::repeater(v, false));
            result->push_back(Symbol::mapStartSymbol());
            return result;
        }
    case AVRO_UNION:
        {
            vector<ProductionPtr> vv;
            size_t c = n->leaves();
            vv.reserve(c);
            for (size_t i = 0; i < c; ++i) {
                vv.push_back(doGenerate(n->leafAt(i), m));
            }
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::alternative(vv));
            result->push_back(Symbol::unionSymbol());
            return result;
        }
    case AVRO_SYMBOLIC:
        {
            shared_ptr<NodeSymbolic> ns = static_pointer_cast<NodeSymbolic>(n);
            NodePtr nn = ns->getNode();
            map<NodePtr, ProductionPtr>::iterator it =
                m.find(nn);
            if (it != m.end() && it->second) {
                return it->second;
            } else {
                m[nn] = ProductionPtr();
                return make_shared<Production>(1, Symbol::placeholder(nn));
            }
        }
    default:
        throw Exception("Unknown node type");
    }
}